

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O2

void nhr_response_parse_body(nhr_response r,char *received,size_t received_len)

{
  char *pcVar1;
  void *__dest;
  size_t size;
  ulong uVar2;
  
  pcVar1 = strstr(received,k_nhr_double_CRLF);
  if ((pcVar1 != (char *)0x0) && (4 < (ulong)((long)pcVar1 - (long)received))) {
    if ((r->transfer_encoding & 1) == 0) {
      uVar2 = (received_len - ((long)pcVar1 - (long)received)) - 4;
      r->body_len = uVar2;
      size = r->content_length + 0x20;
      if (r->content_length <= uVar2) {
        size = uVar2;
      }
      r->body_size = size;
      __dest = nhr_malloc(size);
      r->body = __dest;
      memcpy(__dest,pcVar1 + 4,r->body_len);
    }
    else {
      nhr_response_read_chunks(r,pcVar1 + 4);
    }
    uVar2 = r->content_length;
    if ((uVar2 != 0) && (uVar2 < r->body_len)) {
      r->body_len = uVar2;
    }
  }
  return;
}

Assistant:

void nhr_response_parse_body(nhr_response r, char * received, const size_t received_len) {
#if defined(NHR_DEBUG_LOG)
	size_t log_index = 0;
	printf("\n----[ RESPONSE HEADER ]----\n");
	for (log_index = 0; log_index < received_len; log_index++) {
		printf("%c", received[log_index]);
	}
	printf("\n---------------------------\n");
#endif
	size_t skiped = 0;
	char * sub = strstr(received, k_nhr_double_CRLF);
	if (!sub) {
		return;
	}

	skiped = sub - received;
	if (skiped > k_nhr_double_CRLF_length) {
		sub += k_nhr_double_CRLF_length;
		skiped += k_nhr_double_CRLF_length;

		if (r->transfer_encoding & NHR_TRANSFER_ENCODING_CHUNKED) {
#if !defined(NHR_NO_RECV_CHUNKS)
			nhr_response_read_chunks(r, sub);
#endif
		} else {
			r->body_len = received_len - skiped;
			r->body_size = r->content_length > r->body_len ? r->content_length + 32 : r->body_len;
			r->body = nhr_malloc(r->body_size);
			memcpy(r->body, sub, r->body_len);
		}
		nhr_response_fix_body_len(r);
	}
}